

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

SurfaceInteraction * __thiscall
pbrt::Cylinder::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Cylinder *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  Transform *this_00;
  Transform *pTVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Point3fi pi;
  Normal3f dndu;
  Normal3f dndv;
  undefined1 auVar13 [12];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  Vector3f dpdu;
  Vector3f wo_00;
  Point3f pHit;
  Point3f local_1f8;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  Float local_1dc;
  float local_1d8;
  float fStack_1d4;
  float local_1d0;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  float local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  Tuple3<pbrt::Vector3,_float> local_148;
  Point3fi local_138;
  SurfaceInteraction local_120;
  
  local_1f8.super_Tuple3<pbrt::Point3,_float>.z = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.z;
  local_1f8.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  local_1f8.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  fVar1 = this->phiMax;
  fVar9 = this->zMax - this->zMin;
  auVar14 = vinsertps_avx(ZEXT416((uint)isect->phi),
                          ZEXT416((uint)(local_1f8.super_Tuple3<pbrt::Point3,_float>.z - this->zMin)
                                 ),0x10);
  auVar19 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar9),0x10);
  local_158 = vdivps_avx(auVar14,auVar19);
  auVar14._8_4_ = 0x80000000;
  auVar14._0_8_ = 0x8000000080000000;
  auVar14._12_4_ = 0x80000000;
  auVar14 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar14);
  fVar20 = local_1f8.super_Tuple3<pbrt::Point3,_float>.y * auVar14._0_4_;
  fVar21 = fVar1 * local_1f8.super_Tuple3<pbrt::Point3,_float>.x;
  local_168 = vinsertps_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar21),0x10);
  fVar1 = fVar1 * auVar14._0_4_;
  fVar6 = fVar1 * local_1f8.super_Tuple3<pbrt::Point3,_float>.x;
  fVar7 = fVar1 * local_1f8.super_Tuple3<pbrt::Point3,_float>.y;
  auVar15 = ZEXT816(0) << 0x40;
  auVar18 = ZEXT416((uint)fVar20);
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar21)),ZEXT416((uint)fVar20),auVar18);
  fVar8 = fVar21 * 0.0;
  auVar14 = vfmadd213ss_fma(ZEXT816(0) << 0x40,auVar18,ZEXT416((uint)fVar8));
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar9),auVar15);
  local_178 = ZEXT416((uint)fVar9);
  local_1b8 = vfmadd213ss_fma(local_178,local_178,auVar15);
  fVar5 = fVar21 * fVar9 + 0.0;
  auVar12 = vfnmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar9)),auVar18,local_178);
  fVar9 = (0.0 - fVar20 * fVar9) + auVar12._0_4_;
  auVar12 = vfmsub213ss_fma(ZEXT816(0) << 0x20,auVar18,ZEXT416((uint)fVar8));
  auVar18 = vfnmadd231ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)fVar21),auVar15);
  fVar8 = auVar12._0_4_ + auVar18._0_4_;
  fVar16 = fVar5 * fVar5 + fVar9 * fVar9 + fVar8 * fVar8;
  local_1dc = time;
  if (fVar16 < 0.0) {
    local_188 = ZEXT416((uint)fVar20);
    local_198 = ZEXT416((uint)fVar21);
    local_1e8 = fVar8;
    local_1e4 = fVar9;
    local_1e0 = fVar5;
    local_1a8 = auVar14;
    fVar16 = sqrtf(fVar16);
    auVar19 = ZEXT416(auVar19._0_4_);
    auVar15 = ZEXT816(0) << 0x40;
    fVar9 = local_1e4;
    fVar8 = local_1e8;
    fVar5 = local_1e0;
    auVar14 = local_1a8;
    fVar20 = (float)local_188._0_4_;
    fVar21 = (float)local_198._0_4_;
  }
  else {
    auVar12 = vsqrtss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
    fVar16 = auVar12._0_4_;
  }
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)(fVar5 / fVar16)),
                            ZEXT416((uint)(fVar7 * (fVar9 / fVar16))));
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * 0.0)),ZEXT416((uint)(fVar8 / fVar16)),auVar12);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)((fVar9 / fVar16) * 0.0)),auVar15,
                            ZEXT416((uint)(fVar5 / fVar16)));
  auVar18 = vfmadd231ss_fma(auVar18,auVar15,ZEXT416((uint)(fVar8 / fVar16)));
  auVar17 = ZEXT416((uint)(auVar14._0_4_ * auVar14._0_4_));
  auVar11 = vfmsub213ss_fma(local_1b8,auVar19,auVar17);
  auVar17 = vfnmadd231ss_fma(auVar17,auVar14,auVar14);
  fVar1 = auVar11._0_4_ + auVar17._0_4_;
  uVar10 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar15,0);
  fVar8 = (float)((uint)!(bool)((byte)uVar10 & 1) * (int)(1.0 / fVar1));
  auVar15 = vfmsub231ss_fma(ZEXT416((uint)(local_1b8._0_4_ * auVar12._0_4_)),auVar18,auVar14);
  fVar1 = auVar15._0_4_ * fVar8;
  auVar15._8_4_ = 0x80000000;
  auVar15._0_8_ = 0x8000000080000000;
  auVar15._12_4_ = 0x80000000;
  auVar15 = vxorps_avx512vl(auVar18,auVar15);
  auVar15 = ZEXT416((uint)(auVar19._0_4_ * auVar15._0_4_));
  auVar19 = vfmadd213ss_fma(auVar12,auVar14,auVar15);
  fVar5 = auVar19._0_4_ * fVar8;
  fVar9 = fVar5 * 0.0;
  local_188._0_4_ = fVar1 * 0.0 + (float)local_178._0_4_ * fVar5;
  local_198._0_4_ = fVar20 * fVar1 + fVar9;
  local_1a8._0_4_ = fVar21 * fVar1 + fVar9;
  auVar19 = vfmsub231ss_fma(ZEXT416((uint)(local_1b8._0_4_ * auVar18._0_4_)),auVar18,auVar14);
  fVar1 = auVar19._0_4_ * fVar8;
  auVar14 = vfmadd213ss_fma(auVar18,auVar14,auVar15);
  fVar8 = auVar14._0_4_ * fVar8;
  fVar6 = fVar8 * 0.0;
  fVar8 = fVar1 * 0.0 + (float)local_178._0_4_ * fVar8;
  fVar16 = fVar20 * fVar1 + fVar6;
  fVar6 = fVar21 * fVar1 + fVar6;
  auVar18._8_8_ = 0;
  auVar18._0_4_ = local_1f8.super_Tuple3<pbrt::Point3,_float>.x;
  auVar18._4_4_ = local_1f8.super_Tuple3<pbrt::Point3,_float>.y;
  auVar19._8_4_ = 0x7fffffff;
  auVar19._0_8_ = 0x7fffffff7fffffff;
  auVar19._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx512vl(auVar18,auVar19);
  auVar12._8_4_ = 0x34400002;
  auVar12._0_8_ = 0x3440000234400002;
  auVar12._12_4_ = 0x34400002;
  auVar14 = vmulps_avx512vl(auVar14,auVar12);
  local_148._0_8_ = vmovlps_avx(auVar14);
  local_148.z = 0.0;
  bVar2 = this->reverseOrientation;
  bVar3 = this->transformSwapsHandedness;
  this_00 = this->renderFromObject;
  pTVar4 = this->objectFromRender;
  fVar1 = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar5 = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar9 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pTVar4->m).m[0][1])),ZEXT416((uint)fVar1),
                            ZEXT416((uint)(pTVar4->m).m[0][0]));
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar9),ZEXT416((uint)(pTVar4->m).m[0][2]));
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pTVar4->m).m[1][1])),ZEXT416((uint)fVar1),
                            ZEXT416((uint)(pTVar4->m).m[1][0]));
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar9),ZEXT416((uint)(pTVar4->m).m[1][2]));
  local_1b8 = vinsertps_avx(auVar14,auVar19,0x10);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pTVar4->m).m[2][1])),ZEXT416((uint)fVar1),
                            ZEXT416((uint)(pTVar4->m).m[2][0]));
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar9),ZEXT416((uint)(pTVar4->m).m[2][2]));
  Point3fi::Point3fi(&local_138,&local_1f8,(Vector3f *)&local_148);
  auVar12 = local_168;
  auVar19 = local_1b8;
  local_1c8 = local_198._0_4_;
  uStack_1c4 = local_1a8._0_4_;
  local_1c0 = (float)local_188._0_4_;
  dndv.super_Tuple3<pbrt::Normal3,_float>.y = fVar6;
  dndv.super_Tuple3<pbrt::Normal3,_float>.x = fVar16;
  dndu.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_1a8._0_4_;
  dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_198._0_4_;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_138.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  dndu.super_Tuple3<pbrt::Normal3,_float>.z = (float)local_188._0_4_;
  dndv.super_Tuple3<pbrt::Normal3,_float>.z = fVar8;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_168._0_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_168._4_4_;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.z = auVar14._0_4_;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1b8._0_4_;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1b8._4_4_;
  auVar13._4_8_ = 0;
  auVar13._0_4_ = local_178._0_4_;
  local_1d8 = fVar16;
  fStack_1d4 = fVar6;
  local_1d0 = fVar8;
  local_1b8 = auVar19;
  local_168 = auVar12;
  SurfaceInteraction::SurfaceInteraction
            (&local_120,pi,(Point2f)local_158._0_8_,wo_00,dpdu,(Vector3f)(auVar13 << 0x40),dndu,dndv
             ,local_1dc,bVar2 != bVar3);
  Transform::operator()(__return_storage_ptr__,this_00,&local_120);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of cylinder hit
        Float u = phi / phiMax;
        Float v = (pHit.z - zMin) / (zMax - zMin);
        // Compute cylinder $\dpdu$ and $\dpdv$
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv(0, 0, zMax - zMin);

        // Compute cylinder $\dndu$ and $\dndv$
        Vector3f d2Pduu = -phiMax * phiMax * Vector3f(pHit.x, pHit.y, 0);
        Vector3f d2Pduv(0, 0, 0), d2Pdvv(0, 0, 0);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float EGF2 = DifferenceOfProducts(E, G, F, F);
        Float invEGF2 = (EGF2 == 0) ? Float(0) : 1 / EGF2;
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Compute error bounds for cylinder intersection
        Vector3f pError = gamma(3) * Abs(Vector3f(pHit.x, pHit.y, 0));

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }